

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_mesh_demo.cc
# Opt level: O0

int main(int argc,char **argv)

{
  size_type sVar1;
  pointer argv_00;
  options_description_easy_init *poVar2;
  typed_value<int,_char> *ptVar3;
  size_type sVar4;
  ostream *poVar5;
  variable_value *pvVar6;
  size_type *psVar7;
  StructuredMeshBuilder *pSVar8;
  element_type *peVar9;
  allocator<char> local_341;
  string local_340;
  undefined1 local_320 [8];
  shared_ptr<lf::mesh::Mesh> mesh_p;
  Matrix<double,_2,_1,_0,_2,_1> local_308;
  int local_2f0 [2];
  Matrix<double,_2,_1,_0,_2,_1> local_2e8;
  undefined4 local_2cc;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_2c8;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_2c0;
  undefined1 local_2b8 [8];
  TPTriagMeshBuilder builder;
  string local_270;
  size_type local_250;
  allocator<char> local_249;
  int Ny;
  size_type local_224;
  undefined4 local_220;
  int Nx;
  key_type local_218;
  reading_file *error;
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1c8;
  basic_parsed_options<char> local_1a0;
  undefined1 local_178 [8];
  variables_map vm;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  options_description desc;
  char **argv_local;
  int argc_local;
  
  desc.groups.
  super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "LehrFEM++ demo: construction of tensor producy triangular mesh\nUse the option `-h` to display the control variables."
             ,&local_b9);
  boost::program_options::options_description::options_description
            ((options_description *)local_98,&local_b8,0x50,0x28);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)boost::program_options::options_description::add_options
                         ((options_description *)local_98);
  poVar2 = boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)
                      &vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count,"help,h",
                      "Display help");
  ptVar3 = boost::program_options::value<int>();
  ptVar3 = boost::program_options::typed_value<int,_char>::required(ptVar3);
  poVar2 = boost::program_options::options_description_easy_init::operator()
                     (poVar2,"Nx_cells",(value_semantic *)ptVar3,
                      "No of cells in X direction, must be > 0");
  ptVar3 = boost::program_options::value<int>();
  ptVar3 = boost::program_options::typed_value<int,_char>::required(ptVar3);
  boost::program_options::options_description_easy_init::operator()
            (poVar2,"Ny_cells",(value_semantic *)ptVar3,"No of cells in Y direction, must be > 0");
  boost::program_options::variables_map::variables_map((variables_map *)local_178);
  argv_00 = desc.groups.
            super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1c8.super_function_base.functor._8_8_ = 0;
  local_1c8.super_function_base.functor._16_8_ = 0;
  local_1c8.super_function_base.vtable = (vtable_base *)0x0;
  local_1c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function_n(&local_1c8);
  boost::program_options::parse_command_line<char>
            (&local_1a0,argc,(char **)argv_00,(options_description *)local_98,0,&local_1c8);
  boost::program_options::store(&local_1a0,(variables_map *)local_178,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1a0);
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function_n(&local_1c8);
  boost::program_options::parse_config_file<char>
            ((basic_parsed_options<char> *)&error,"setup.vars",(options_description *)local_98,false
            );
  boost::program_options::store((parsed_options *)&error,(variables_map *)local_178,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)&error);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"help",(allocator<char> *)((long)&Nx + 3));
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)&vm.super_abstract_variables_map.m_next,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Nx + 3));
  if (sVar4 == 0) {
    boost::program_options::notify((variables_map *)local_178);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&Ny,"Nx_cells",&local_249);
    pvVar6 = boost::program_options::variables_map::operator[]
                       ((variables_map *)local_178,(string *)&Ny);
    psVar7 = (size_type *)boost::program_options::variable_value::as<int>(pvVar6);
    sVar1 = *psVar7;
    std::__cxx11::string::~string((string *)&Ny);
    std::allocator<char>::~allocator(&local_249);
    local_224 = sVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"Ny_cells",
               (allocator<char> *)&builder.super_StructuredMeshBuilder.field_0x3f);
    pvVar6 = boost::program_options::variables_map::operator[]
                       ((variables_map *)local_178,&local_270);
    psVar7 = (size_type *)boost::program_options::variable_value::as<int>(pvVar6);
    sVar1 = *psVar7;
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator
              ((allocator<char> *)&builder.super_StructuredMeshBuilder.field_0x3f);
    local_250 = sVar1;
    if ((local_224 == 0) || (sVar1 == 0)) {
      std::operator<<((ostream *)&std::cout,
                      "Nx and Ny must not be zero, set using options --Nx_cells and --Ny_cells\n");
      argv_local._4_4_ = 0;
      local_220 = 1;
    }
    else {
      local_2cc = 2;
      std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_2c8);
      std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
      unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
                ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
                 &local_2c0,&local_2c8);
      lf::mesh::utils::TPTriagMeshBuilder::TPTriagMeshBuilder
                ((TPTriagMeshBuilder *)local_2b8,&local_2c0);
      std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
      ~unique_ptr(&local_2c0);
      std::
      unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
      ::~unique_ptr(&local_2c8);
      local_2f0[1] = 0;
      local_2f0[0] = 0;
      Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
                ((Matrix<double,2,1,0,2,1> *)&local_2e8,local_2f0 + 1,local_2f0);
      pSVar8 = lf::mesh::utils::StructuredMeshBuilder::
               setBottomLeftCorner<Eigen::Matrix<double,2,1,0,2,1>>
                         ((StructuredMeshBuilder *)local_2b8,&local_2e8);
      mesh_p.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = 1;
      mesh_p.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 1;
      Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
                ((Matrix<double,2,1,0,2,1> *)&local_308,
                 (int *)((long)&mesh_p.
                                super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 4),
                 (int *)&mesh_p.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      pSVar8 = lf::mesh::utils::StructuredMeshBuilder::
               setTopRightCorner<Eigen::Matrix<double,2,1,0,2,1>>(pSVar8,&local_308);
      pSVar8 = lf::mesh::utils::StructuredMeshBuilder::setNumXCells(pSVar8,local_224);
      lf::mesh::utils::StructuredMeshBuilder::setNumYCells(pSVar8,local_250);
      lf::mesh::utils::TPTriagMeshBuilder::Build((TPTriagMeshBuilder *)local_320);
      poVar5 = std::operator<<((ostream *)&std::cout,"Checking entity indexing");
      std::operator<<(poVar5,'\n');
      peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_320);
      lf::mesh::test_utils::checkEntityIndexing(peVar9);
      poVar5 = std::operator<<((ostream *)&std::cout,"Checking mesh completeness");
      std::operator<<(poVar5,'\n');
      peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_320);
      lf::mesh::test_utils::checkMeshCompleteness(peVar9);
      peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_320);
      lf::mesh::utils::PrintInfo((ostream *)&std::cout,peVar9,0xb);
      peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_320);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,"lf_tptriagmesh.m",&local_341);
      lf::io::writeMatlab(peVar9,&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator(&local_341);
      argv_local._4_4_ = 0;
      local_220 = 1;
      std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)local_320);
      lf::mesh::utils::TPTriagMeshBuilder::~TPTriagMeshBuilder((TPTriagMeshBuilder *)local_2b8);
    }
  }
  else {
    poVar5 = boost::program_options::operator<<
                       ((ostream *)&std::cout,(options_description *)local_98);
    std::operator<<(poVar5,'\n');
    argv_local._4_4_ = 1;
    local_220 = 1;
  }
  boost::program_options::variables_map::~variables_map((variables_map *)local_178);
  boost::program_options::options_description::~options_description((options_description *)local_98)
  ;
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  using size_type = lf::base::size_type;

  namespace po = boost::program_options;

  // clang-format off
  po::options_description desc("LehrFEM++ demo: construction of tensor producy triangular mesh\nUse the option `-h` to display the control variables.");
  desc.add_options()
    ("help,h", "Display help")
    ("Nx_cells", po::value<int>()->required(), "No of cells in X direction, must be > 0")
    ("Ny_cells", po::value<int>()->required(), "No of cells in Y direction, must be > 0")
  ;
  //clang-format on

  // Set control variables from command line or file "setup vars"
  // check for file with options
  po::variables_map vm;
  po::store(po::parse_command_line(argc, argv, desc), vm);
  try {
    po::store(po::parse_config_file<char>("setup.vars", desc), vm);
  } catch(const po::reading_file& error) {
    std::cout << "No file `setup.vars` specifying control variables\n";
  }

  if(vm.count("help") > 0) {
    std::cout << desc << '\n';
    return 1;
  }

  po::notify(vm);

  

  // number of cells cannot be 0, that would result in segfault!
  const int Nx = vm["Nx_cells"].as<int>();
  const int Ny = vm["Ny_cells"].as<int>();
  if (Nx == 0 || Ny == 0) {
    std::cout << "Nx and Ny must not be zero, set using options --Nx_cells and "
                 "--Ny_cells\n";
    return 0;
  }

  // Construct a triangular tensor product mesh with 2*Nx*Ny cells
  lf::mesh::utils::TPTriagMeshBuilder builder(
      std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2));
  // Set mesh parameters following the Builder pattern
  // Domain is the unit square
  builder.setBottomLeftCorner(Eigen::Vector2d{0, 0})
      .setTopRightCorner(Eigen::Vector2d{1, 1})
      .setNumXCells(Nx)
      .setNumYCells(Ny);
  auto mesh_p = builder.Build();

  // Some consistency checks.
  // These should not be included in a regular code
  std::cout << "Checking entity indexing" << '\n';
  lf::mesh::test_utils::checkEntityIndexing(*mesh_p);
  std::cout << "Checking mesh completeness" << '\n';
  lf::mesh::test_utils::checkMeshCompleteness(*mesh_p);

  // Printing mesh information
  lf::mesh::utils::PrintInfo(std::cout, *mesh_p);

  // Matlab output of mesh
  lf::io::writeMatlab(*mesh_p, "lf_tptriagmesh.m");
  return 0;
}